

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erasenonleaf
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,int *cur,
          node **p,int *pp,locType *pos)

{
  long *plVar1;
  unsigned_long_long *puVar2;
  locType *plVar3;
  uint uVar4;
  long lVar5;
  locType *plVar6;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar13;
  node *pnVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  undefined8 uStack_80;
  unsigned_long_long uStack_78;
  int local_6c;
  locType *local_68;
  undefined1 *local_60;
  ulong local_58;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_50;
  uint local_44;
  int *local_40;
  int *local_38;
  node *pnVar12;
  
  iVar13 = *cur;
  lVar11 = (long)(pp[iVar13] + 1);
  while( true ) {
    pnVar12 = p[iVar13];
    iVar10 = pnVar12->sz;
    if (iVar10 <= lVar11) break;
    pnVar12->keyvalue[lVar11 + -1] = pnVar12->keyvalue[lVar11];
    (pnVar12->field_0).val[lVar11] = *(long *)((long)&pnVar12->field_0 + lVar11 * 8 + 8);
    lVar11 = lVar11 + 1;
  }
  pnVar12->sz = iVar10 + -1;
  lVar11 = (long)*cur;
  if (lVar11 == 0) {
    if (iVar10 + -1 == 0) {
      this->depth = this->depth + -1;
      uStack_80 = 0x109541;
      DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      ::release(this->file,this->root);
      this->root = pos[1];
      return;
    }
    pDVar18 = this->file;
    UNRECOVERED_JUMPTABLE =
         (pDVar18->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         )._vptr_FileManager_Base[3];
  }
  else {
    if (iVar10 < 0x32) {
      iVar10 = pp[lVar11 + -1];
      local_50 = this;
      local_40 = cur;
      local_38 = pp;
      if (iVar10 == p[lVar11 + -1]->sz) {
        p[lVar11 + 1] = p[lVar11];
        pp[lVar11 + 1] = iVar10;
        lVar11 = (long)*cur;
        pos[lVar11 + 1] = pos[lVar11];
        pp[lVar11 + -1] = p[lVar11 + -1]->sz + -1;
        lVar11 = (long)*cur;
        pos[lVar11] = (p[lVar11 + -1]->field_0).val[pp[lVar11 + -1]];
        uStack_80 = 0x1091e1;
        iVar9 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        iVar10 = *local_40;
        lVar11 = (long)iVar10;
        p[lVar11] = (node *)CONCAT44(extraout_var,iVar9);
        pnVar12 = p[lVar11 + 1];
      }
      else {
        pp[lVar11 + 1] = iVar10 + 1;
        lVar11 = (long)*cur;
        pos[lVar11 + 1] = (p[lVar11 + -1]->field_0).val[pp[lVar11 + 1]];
        uStack_80 = 0x10921f;
        iVar10 = (*(this->file->
                   super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                   )._vptr_FileManager_Base[2])();
        pnVar12 = (node *)CONCAT44(extraout_var_00,iVar10);
        iVar10 = *local_40;
        lVar11 = (long)iVar10;
        p[lVar11 + 1] = pnVar12;
      }
      piVar8 = local_40;
      pBVar7 = local_50;
      pnVar14 = p[iVar13];
      iVar9 = pnVar14->sz;
      iVar19 = pnVar12->sz;
      uVar15 = iVar19 + iVar9;
      if ((int)uVar15 < 99) {
        pnVar14->keyvalue[iVar9] = p[(long)iVar10 + -1]->keyvalue[local_38[(long)iVar10 + -1]];
        for (lVar16 = 0; lVar16 < iVar19; lVar16 = lVar16 + 1) {
          (pnVar14->field_0).val[iVar9 + (int)lVar16 + 1] = (pnVar12->field_0).val[lVar16];
          pnVar12 = p[lVar11 + 1];
          pnVar14 = p[iVar13];
          iVar9 = pnVar14->sz;
          pnVar14->keyvalue[(int)lVar16 + 1 + iVar9] = pnVar12->keyvalue[lVar16];
          iVar19 = pnVar12->sz;
        }
        lVar11 = (pnVar12->field_0).val[iVar19];
        iVar13 = iVar19 + iVar9 + 1;
        pnVar14->sz = iVar13;
        (pnVar14->field_0).val[iVar13] = lVar11;
        uStack_80 = 0x10936a;
        (*(local_50->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(local_50->file,pos + *local_40);
        uStack_80 = 0x10937b;
        DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ::release(pBVar7->file,pos[(long)*piVar8 + 1]);
        local_6c = *piVar8 + -1;
        uStack_80 = 0x109398;
        erasenonleaf(pBVar7,&local_6c,p,local_38,pos);
      }
      else {
        local_68 = pos;
        local_60 = (undefined1 *)&uStack_78;
        uVar23 = (ulong)uVar15;
        local_58 = uVar23 + 1;
        lVar16 = -(uVar23 * 8 + 0x1f & 0xfffffffffffffff0);
        lVar17 = lVar16 + -0x78;
        lVar5 = lVar17 - (uVar23 * 8 + 0x17 & 0xffffffff0);
        pnVar12 = p[iVar13];
        uVar4 = pnVar12->sz;
        lVar24 = (long)(int)uVar4;
        uVar25 = 0;
        uVar20 = 0;
        if (0 < (int)uVar4) {
          uVar20 = (ulong)uVar4;
        }
        for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          *(long *)((long)&uStack_78 + uVar25 * 8 + lVar17 + 0x78) = (pnVar12->field_0).val[uVar25];
          *(unsigned_long_long *)((long)&uStack_78 + uVar25 * 8 + lVar5 + 0x78) =
               pnVar12->keyvalue[uVar25];
        }
        local_44 = uVar15;
        plVar1 = (long *)((long)&uStack_78 + lVar24 * 8 + lVar17 + 0x78);
        *plVar1 = (pnVar12->field_0).val[lVar24];
        puVar2 = (unsigned_long_long *)((long)&uStack_78 + lVar24 * 8 + lVar5 + 0x78);
        *puVar2 = p[(long)*local_40 + -1]->keyvalue[local_38[(long)*local_40 + -1]];
        for (lVar21 = 0; uVar20 = local_58, lVar24 + lVar21 < (long)uVar23; lVar21 = lVar21 + 1) {
          pnVar14 = p[lVar11 + 1];
          plVar1[lVar21 + 1] = (pnVar14->field_0).val[(int)lVar21];
          puVar2[lVar21 + 1] = pnVar14->keyvalue[(int)lVar21];
        }
        pnVar14 = p[lVar11 + 1];
        lVar24 = (pnVar14->field_0).val[pnVar14->sz];
        *(long *)((long)&uStack_78 + local_58 * 8 + lVar17 + 0x78) = lVar24;
        piVar8 = local_40;
        pBVar7 = local_50;
        plVar6 = local_68;
        uVar15 = (uint)(uVar20 >> 1) & 0x7fffffff;
        pnVar12->sz = uVar15;
        pnVar14->sz = local_44 - uVar15;
        for (lVar21 = 0; lVar22 = (long)pnVar12->sz, lVar21 < lVar22; lVar21 = lVar21 + 1) {
          (pnVar12->field_0).val[lVar21] = *(long *)((long)&uStack_78 + lVar21 * 8 + lVar17 + 0x78);
          pnVar12 = p[iVar13];
          pnVar12->keyvalue[lVar21] =
               *(unsigned_long_long *)((long)&uStack_78 + lVar21 * 8 + lVar5 + 0x78);
        }
        (pnVar12->field_0).val[lVar22] = *(long *)((long)&uStack_78 + lVar22 * 8 + lVar17 + 0x78);
        lVar17 = (long)p[iVar13]->sz;
        p[(long)*local_40 + -1]->keyvalue[local_38[(long)*local_40 + -1]] =
             *(unsigned_long_long *)((long)&uStack_78 + lVar17 * 8 + lVar5 + 0x78);
        pnVar12 = p[lVar11 + 1];
        for (lVar21 = 0; lVar21 < pnVar12->sz; lVar21 = lVar21 + 1) {
          (pnVar12->field_0).val[lVar21] =
               *(long *)(&stack0xffffffffffffff90 + (long)((int)lVar17 + (int)lVar21) * 8 + lVar16);
          lVar17 = (long)p[iVar13]->sz;
          pnVar12 = p[lVar11 + 1];
          pnVar12->keyvalue[lVar21] =
               *(unsigned_long_long *)
                (&stack0xffffffffffffff90 + (lVar17 + lVar21) * 8 + lVar5 + 0x78);
        }
        (pnVar12->field_0).val[pnVar12->sz] = lVar24;
        pDVar18 = local_50->file;
        plVar3 = local_68 + *local_40;
        UNRECOVERED_JUMPTABLE =
             (pDVar18->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)&uStack_80 + lVar5 + 0x78) = 0x1094fe;
        (*UNRECOVERED_JUMPTABLE)(pDVar18,plVar3);
        pDVar18 = pBVar7->file;
        iVar13 = *piVar8;
        UNRECOVERED_JUMPTABLE =
             (pDVar18->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)&uStack_80 + lVar5 + 0x78) = 0x109513;
        (*UNRECOVERED_JUMPTABLE)(pDVar18,plVar6 + (long)iVar13 + 1);
        pDVar18 = pBVar7->file;
        iVar13 = *piVar8;
        UNRECOVERED_JUMPTABLE =
             (pDVar18->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)&uStack_80 + lVar5 + 0x78) = 0x109528;
        (*UNRECOVERED_JUMPTABLE)(pDVar18,plVar6 + (long)iVar13 + -1);
      }
      return;
    }
    pDVar18 = this->file;
    pos = pos + lVar11;
    UNRECOVERED_JUMPTABLE =
         (pDVar18->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         )._vptr_FileManager_Base[3];
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar18,pos);
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }